

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef conv_str_tonum(jit_State *J,TRef tr,TValue *o)

{
  int iVar1;
  TValue *in_RDX;
  TRef in_ESI;
  jit_State *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((in_ESI & 0x1f000000) == 0x4000000) {
    (in_RDI->fold).ins.field_0.ot = 0x5c8e;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0;
    in_ESI = lj_opt_fold(in_RDI);
    iVar1 = lj_strscan_num((GCstr *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDX);
    if (iVar1 == 0) {
      lj_trace_err((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                   (TraceError)((ulong)in_RDX >> 0x20));
    }
  }
  return in_ESI;
}

Assistant:

static TRef conv_str_tonum(jit_State *J, TRef tr, TValue *o)
{
  if (tref_isstr(tr)) {
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    /* Would need an inverted STRTO for this rare and useless case. */
    if (!lj_strscan_num(strV(o), o))  /* Convert in-place. Value used below. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* Punt if non-numeric. */
  }
  return tr;
}